

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int llex(LexState *ls,SemInfo *seminfo)

{
  size_t sVar1;
  ushort uVar2;
  int iVar3;
  ZIO *pZVar4;
  byte *pbVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ushort **ppuVar10;
  TString *pTVar11;
  char *msg;
  int c;
  
  ls->buff->n = 0;
LAB_0010bae4:
  uVar7 = ls->current;
  if ((long)(int)uVar7 < 0x22) {
    if ((uVar7 == 10) || (uVar7 == 0xd)) {
      inclinenumber(ls);
      goto LAB_0010bae4;
    }
    if (uVar7 == 0xffffffff) {
      return 0x11f;
    }
  }
  else {
    if ((int)uVar7 < 0x2e) {
      if (uVar7 != 0x2d) {
        if ((uVar7 != 0x22) && (uVar7 != 0x27)) goto LAB_0010bc2b;
        save(ls,uVar7);
        pZVar4 = ls->z;
        sVar1 = pZVar4->n;
        pZVar4->n = pZVar4->n - 1;
        if (sVar1 == 0) {
          uVar9 = luaZ_fill(pZVar4);
        }
        else {
          pbVar5 = (byte *)pZVar4->p;
          pZVar4->p = (char *)(pbVar5 + 1);
          uVar9 = (uint)*pbVar5;
        }
        ls->current = uVar9;
        goto joined_r0x0010bd4c;
      }
      pZVar4 = ls->z;
      sVar1 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar1 == 0) {
        uVar7 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar7 = (uint)*pbVar5;
      }
      ls->current = uVar7;
      if (uVar7 != 0x2d) {
        return 0x2d;
      }
      pZVar4 = ls->z;
      sVar1 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar1 == 0) {
        uVar7 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar7 = (uint)*pbVar5;
      }
      ls->current = uVar7;
      if (uVar7 == 0x5b) {
        iVar6 = skip_sep(ls);
        ls->buff->n = 0;
        if (iVar6 < 0) goto LAB_0010bbcb;
        read_long_string(ls,(SemInfo *)0x0,iVar6);
        ls->buff->n = 0;
      }
      else {
LAB_0010bbcb:
        while ((uVar7 = ls->current + 1, 0xe < uVar7 || ((0x4801U >> (uVar7 & 0x1f) & 1) == 0))) {
          pZVar4 = ls->z;
          sVar1 = pZVar4->n;
          pZVar4->n = pZVar4->n - 1;
          if (sVar1 == 0) {
            uVar7 = luaZ_fill(pZVar4);
          }
          else {
            pbVar5 = (byte *)pZVar4->p;
            pZVar4->p = (char *)(pbVar5 + 1);
            uVar7 = (uint)*pbVar5;
          }
          ls->current = uVar7;
        }
      }
      goto LAB_0010bae4;
    }
    if ((int)uVar7 < 0x3e) {
      if (uVar7 != 0x2e) {
        if (uVar7 == 0x3c) {
          pZVar4 = ls->z;
          sVar1 = pZVar4->n;
          pZVar4->n = pZVar4->n - 1;
          if (sVar1 == 0) {
            uVar7 = luaZ_fill(pZVar4);
          }
          else {
            pbVar5 = (byte *)pZVar4->p;
            pZVar4->p = (char *)(pbVar5 + 1);
            uVar7 = (uint)*pbVar5;
          }
          ls->current = uVar7;
          if (uVar7 != 0x3d) {
            return 0x3c;
          }
          pZVar4 = ls->z;
          sVar1 = pZVar4->n;
          pZVar4->n = pZVar4->n - 1;
          if (sVar1 == 0) {
            uVar7 = luaZ_fill(pZVar4);
          }
          else {
            pbVar5 = (byte *)pZVar4->p;
            pZVar4->p = (char *)(pbVar5 + 1);
            uVar7 = (uint)*pbVar5;
          }
          ls->current = uVar7;
          return 0x11a;
        }
        if (uVar7 == 0x3d) {
          pZVar4 = ls->z;
          sVar1 = pZVar4->n;
          pZVar4->n = pZVar4->n - 1;
          if (sVar1 == 0) {
            uVar7 = luaZ_fill(pZVar4);
          }
          else {
            pbVar5 = (byte *)pZVar4->p;
            pZVar4->p = (char *)(pbVar5 + 1);
            uVar7 = (uint)*pbVar5;
          }
          ls->current = uVar7;
          if (uVar7 != 0x3d) {
            return 0x3d;
          }
          pZVar4 = ls->z;
          sVar1 = pZVar4->n;
          pZVar4->n = pZVar4->n - 1;
          if (sVar1 == 0) {
            uVar7 = luaZ_fill(pZVar4);
          }
          else {
            pbVar5 = (byte *)pZVar4->p;
            pZVar4->p = (char *)(pbVar5 + 1);
            uVar7 = (uint)*pbVar5;
          }
          ls->current = uVar7;
          return 0x118;
        }
        goto LAB_0010bc2b;
      }
      save(ls,0x2e);
      pZVar4 = ls->z;
      sVar1 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar1 == 0) {
        uVar7 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar7 = (uint)*pbVar5;
      }
      ls->current = uVar7;
      iVar6 = check_next(ls,".");
      if (iVar6 != 0) {
        iVar6 = check_next(ls,".");
        return 0x117 - (uint)(iVar6 == 0);
      }
      ppuVar10 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar10 + (long)ls->current * 2 + 1) & 8) == 0) {
        return 0x2e;
      }
      goto LAB_0010c178;
    }
    if (uVar7 == 0x3e) {
      pZVar4 = ls->z;
      sVar1 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar1 == 0) {
        uVar7 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar7 = (uint)*pbVar5;
      }
      ls->current = uVar7;
      if (uVar7 != 0x3d) {
        return 0x3e;
      }
      pZVar4 = ls->z;
      sVar1 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar1 == 0) {
        uVar7 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar7 = (uint)*pbVar5;
      }
      ls->current = uVar7;
      return 0x119;
    }
    if (uVar7 == 0x5b) {
      iVar6 = skip_sep(ls);
      if (-1 < iVar6) {
        read_long_string(ls,seminfo,iVar6);
        return 0x11e;
      }
      if (iVar6 == -1) {
        return 0x5b;
      }
      msg = "invalid long string delimiter";
      goto LAB_0010c227;
    }
    if (uVar7 == 0x7e) {
      pZVar4 = ls->z;
      sVar1 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar1 == 0) {
        uVar7 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar7 = (uint)*pbVar5;
      }
      ls->current = uVar7;
      if (uVar7 != 0x3d) {
        return 0x7e;
      }
      pZVar4 = ls->z;
      sVar1 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar1 == 0) {
        uVar7 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar7 = (uint)*pbVar5;
      }
      ls->current = uVar7;
      return 0x11b;
    }
  }
LAB_0010bc2b:
  ppuVar10 = __ctype_b_loc();
  uVar2 = (*ppuVar10)[(int)uVar7];
  if ((uVar2 >> 0xd & 1) == 0) {
    if ((uVar2 >> 0xb & 1) == 0) {
      if ((uVar7 == 0x5f) || ((uVar2 & 0x400) != 0)) {
        do {
          save(ls,ls->current);
          pZVar4 = ls->z;
          sVar1 = pZVar4->n;
          pZVar4->n = pZVar4->n - 1;
          if (sVar1 == 0) {
            uVar7 = luaZ_fill(pZVar4);
          }
          else {
            pbVar5 = (byte *)pZVar4->p;
            pZVar4->p = (char *)(pbVar5 + 1);
            uVar7 = (uint)*pbVar5;
          }
          ls->current = uVar7;
        } while ((uVar7 == 0x5f) || (((*ppuVar10)[(int)uVar7] & 8) != 0));
        pTVar11 = luaX_newstring(ls,ls->buff->buffer,ls->buff->n);
        if ((pTVar11->tsv).reserved == 0) {
          seminfo->ts = pTVar11;
          uVar7 = 0x11d;
        }
        else {
          uVar7 = (pTVar11->tsv).reserved | 0x100;
        }
      }
      else {
        pZVar4 = ls->z;
        sVar1 = pZVar4->n;
        pZVar4->n = pZVar4->n - 1;
        if (sVar1 == 0) {
          uVar9 = luaZ_fill(pZVar4);
        }
        else {
          pbVar5 = (byte *)pZVar4->p;
          pZVar4->p = (char *)(pbVar5 + 1);
          uVar9 = (uint)*pbVar5;
        }
        ls->current = uVar9;
      }
    }
    else {
LAB_0010c178:
      read_numeral(ls,seminfo);
      uVar7 = 0x11c;
    }
    return uVar7;
  }
  pZVar4 = ls->z;
  sVar1 = pZVar4->n;
  pZVar4->n = pZVar4->n - 1;
  if (sVar1 == 0) {
    uVar7 = luaZ_fill(pZVar4);
  }
  else {
    pbVar5 = (byte *)pZVar4->p;
    pZVar4->p = (char *)(pbVar5 + 1);
    uVar7 = (uint)*pbVar5;
  }
  ls->current = uVar7;
  goto LAB_0010bae4;
joined_r0x0010bd4c:
  if (uVar9 == uVar7) {
    save(ls,uVar9);
    pZVar4 = ls->z;
    sVar1 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar1 == 0) {
      uVar7 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar7 = (uint)*pbVar5;
    }
    ls->current = uVar7;
    pTVar11 = luaX_newstring(ls,ls->buff->buffer + 1,ls->buff->n - 2);
    seminfo->ts = pTVar11;
    return 0x11e;
  }
  if ((int)uVar9 < 0x5c) {
    if (uVar9 == 0xffffffff) {
      luaX_lexerror(ls,"unfinished string",0x11f);
    }
    if ((uVar9 == 10) || (uVar9 == 0xd)) {
      msg = "unfinished string";
LAB_0010c227:
      luaX_lexerror(ls,msg,0x11e);
    }
  }
  else {
    if (uVar9 != 0x5c) goto LAB_0010bdb1;
    pZVar4 = ls->z;
    sVar1 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar1 == 0) {
      uVar8 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar8 = (uint)*pbVar5;
    }
    ls->current = uVar8;
    if ((int)uVar8 < 0x62) {
      if ((int)uVar8 < 0xd) {
        if (uVar8 == 0xffffffff) goto LAB_0010bdd8;
        if (uVar8 != 10) goto switchD_0010be23_caseD_6f;
      }
      else if (uVar8 != 0xd) {
        uVar9 = 7;
        if (uVar8 != 0x61) goto switchD_0010be23_caseD_6f;
        goto LAB_0010bdb1;
      }
      save(ls,10);
      inclinenumber(ls);
      goto LAB_0010bdd8;
    }
    switch(uVar8) {
    case 0x6e:
      uVar9 = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
switchD_0010be23_caseD_6f:
      ppuVar10 = __ctype_b_loc();
      uVar9 = uVar8;
      if ((*(byte *)((long)*ppuVar10 + (long)(int)uVar8 * 2 + 1) & 8) != 0) {
        c = 0;
        iVar6 = 3;
        do {
          iVar3 = ls->current;
          pZVar4 = ls->z;
          sVar1 = pZVar4->n;
          pZVar4->n = pZVar4->n - 1;
          if (sVar1 == 0) {
            uVar9 = luaZ_fill(pZVar4);
          }
          else {
            pbVar5 = (byte *)pZVar4->p;
            pZVar4->p = (char *)(pbVar5 + 1);
            uVar9 = (uint)*pbVar5;
          }
          c = iVar3 + c * 10 + -0x30;
          ls->current = uVar9;
          iVar6 = iVar6 + -1;
        } while ((iVar6 != 0) && ((*(byte *)((long)*ppuVar10 + (long)(int)uVar9 * 2 + 1) & 8) != 0))
        ;
        if (c < 0x100) {
          save(ls,c);
          goto LAB_0010bdd8;
        }
        msg = "escape sequence too large";
        goto LAB_0010c227;
      }
      break;
    case 0x72:
      uVar9 = 0xd;
      break;
    case 0x74:
      uVar9 = 9;
      break;
    case 0x76:
      uVar9 = 0xb;
      break;
    default:
      if (uVar8 == 0x66) {
        uVar9 = 0xc;
      }
      else {
        if (uVar8 != 0x62) goto switchD_0010be23_caseD_6f;
        uVar9 = 8;
      }
    }
  }
LAB_0010bdb1:
  save(ls,uVar9);
  pZVar4 = ls->z;
  sVar1 = pZVar4->n;
  pZVar4->n = pZVar4->n - 1;
  if (sVar1 == 0) {
    uVar9 = luaZ_fill(pZVar4);
  }
  else {
    pbVar5 = (byte *)pZVar4->p;
    pZVar4->p = (char *)(pbVar5 + 1);
    uVar9 = (uint)*pbVar5;
  }
  ls->current = uVar9;
LAB_0010bdd8:
  uVar9 = ls->current;
  goto joined_r0x0010bd4c;
}

Assistant:

static int llex(LexState*ls,SemInfo*seminfo){
luaZ_resetbuffer(ls->buff);
for(;;){
switch(ls->current){
case'\n':
case'\r':{
inclinenumber(ls);
continue;
}
case'-':{
next(ls);
if(ls->current!='-')return'-';
next(ls);
if(ls->current=='['){
int sep=skip_sep(ls);
luaZ_resetbuffer(ls->buff);
if(sep>=0){
read_long_string(ls,NULL,sep);
luaZ_resetbuffer(ls->buff);
continue;
}
}
while(!currIsNewline(ls)&&ls->current!=(-1))
next(ls);
continue;
}
case'[':{
int sep=skip_sep(ls);
if(sep>=0){
read_long_string(ls,seminfo,sep);
return TK_STRING;
}
else if (sep!=-1)luaX_lexerror(ls,"invalid long string delimiter",TK_STRING);
return'[';
}
case'=':{
next(ls);
if(ls->current!='=')return'=';
else{next(ls);return TK_EQ;}
}
case'<':{
next(ls);
if(ls->current!='=')return'<';
else{next(ls);return TK_LE;}
}
case'>':{
next(ls);
if(ls->current!='=')return'>';
else{next(ls);return TK_GE;}
}
case'~':{
next(ls);
if(ls->current!='=')return'~';
else{next(ls);return TK_NE;}
}
case'"':
case'\'':{
read_string(ls,ls->current,seminfo);
return TK_STRING;
}
case'.':{
save_and_next(ls);
if(check_next(ls,".")){
if(check_next(ls,"."))
return TK_DOTS;
else return TK_CONCAT;
}
else if(!isdigit(ls->current))return'.';
else{
read_numeral(ls,seminfo);
return TK_NUMBER;
}
}
case(-1):{
return TK_EOS;
}
default:{
if(isspace(ls->current)){
next(ls);
continue;
}
else if(isdigit(ls->current)){
read_numeral(ls,seminfo);
return TK_NUMBER;
}
else if(isalpha(ls->current)||ls->current=='_'){
TString*ts;
do{
save_and_next(ls);
}while(isalnum(ls->current)||ls->current=='_');
ts=luaX_newstring(ls,luaZ_buffer(ls->buff),
luaZ_bufflen(ls->buff));
if(ts->tsv.reserved>0)
return ts->tsv.reserved-1+257;
else{
seminfo->ts=ts;
return TK_NAME;
}
}
else{
int c=ls->current;
next(ls);
return c;
}
}
}
}
}